

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O0

bool __thiscall Minisat::SimpSolver::backwardSubsumptionCheck(SimpSolver *this,bool verbose)

{
  uint64_t uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint32_t uVar6;
  uint uVar7;
  Lit l_00;
  Lit *pLVar8;
  Clause *pCVar9;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *this_00;
  vec<unsigned_int> *pvVar10;
  uint *puVar11;
  byte in_SIL;
  SimpSolver *in_RDI;
  Lit l_1;
  int j;
  CRef *cs;
  vec<unsigned_int> *_cs;
  int i;
  Var best;
  Clause *c;
  CRef cr;
  Lit l;
  int deleted_literals;
  int subsumed;
  int cnt;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>
  *in_stack_ffffffffffffff60;
  Lit in_stack_ffffffffffffff8c;
  Lit in_stack_ffffffffffffff90;
  Lit in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  Lit local_60;
  int local_3c;
  int local_34;
  uint local_20;
  uint local_1c;
  int local_18;
  
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  do {
    do {
      iVar3 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      bVar2 = true;
      if (iVar3 < 1) {
        iVar3 = in_RDI->bwdsub_assigns;
        iVar4 = vec<Minisat::Lit>::size(&(in_RDI->super_Solver).trail);
        bVar2 = iVar3 < iVar4;
      }
      if (!bVar2) {
        return true;
      }
      if ((((in_RDI->super_Solver).asynch_interrupt & 1U) != 0) ||
         (bVar2 = isInSimpLimit(in_RDI), !bVar2)) {
        Queue<unsigned_int>::clear
                  ((Queue<unsigned_int> *)in_stack_ffffffffffffff50,
                   SUB41(in_stack_ffffffffffffff4c >> 0x18,0));
        iVar3 = vec<Minisat::Lit>::size(&(in_RDI->super_Solver).trail);
        in_RDI->bwdsub_assigns = iVar3;
        return true;
      }
      iVar3 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      if ((iVar3 == 0) &&
         (iVar3 = in_RDI->bwdsub_assigns,
         iVar4 = vec<Minisat::Lit>::size(&(in_RDI->super_Solver).trail), iVar3 < iVar4)) {
        iVar3 = in_RDI->bwdsub_assigns;
        in_RDI->bwdsub_assigns = iVar3 + 1;
        pLVar8 = vec<Minisat::Lit>::operator[](&(in_RDI->super_Solver).trail,iVar3);
        iVar3 = pLVar8->x;
        pCVar9 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        pLVar8 = Clause::operator[](pCVar9,0);
        pLVar8->x = iVar3;
        ClauseAllocator::operator[]
                  ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        Clause::calcAbstraction((Clause *)in_stack_ffffffffffffff60);
        Queue<unsigned_int>::insert
                  ((Queue<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff94.x,in_stack_ffffffffffffff90.x),
                   in_stack_ffffffffffffff8c.x);
        (in_RDI->super_Solver).statistics.simpSteps =
             (in_RDI->super_Solver).statistics.simpSteps + 1;
      }
      uVar5 = Queue<unsigned_int>::peek((Queue<unsigned_int> *)0x15c678);
      Queue<unsigned_int>::pop((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      this_00 = (OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted> *)
                ClauseAllocator::operator[]
                          ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
      (in_RDI->super_Solver).statistics.simpSteps = (in_RDI->super_Solver).statistics.simpSteps + 1;
      uVar6 = Clause::mark((Clause *)this_00);
    } while (uVar6 != 0);
    Clause::setOnQueue((Clause *)this_00,false);
    if ((((in_SIL & 1) != 0) && (1 < (in_RDI->super_Solver).verbosity)) &&
       (iVar3 = local_18 + 1, iVar4 = local_18 % 1000, local_18 = iVar3, iVar4 == 0)) {
      uVar7 = Queue<unsigned_int>::size((Queue<unsigned_int> *)in_stack_ffffffffffffff50);
      printf("c subsumption left: %10d (%10d subsumed, %10d deleted literals)\r",(ulong)uVar7,
             (ulong)local_1c,(ulong)local_20);
    }
    pLVar8 = Clause::operator[]((Clause *)this_00,0);
    local_34 = var((Lit)pLVar8->x);
    for (local_3c = 1; iVar3 = Clause::size((Clause *)this_00), local_3c < iVar3;
        local_3c = local_3c + 1) {
      in_stack_ffffffffffffff60 = &in_RDI->occurs;
      pLVar8 = Clause::operator[]((Clause *)this_00,local_3c);
      var((Lit)pLVar8->x);
      pvVar10 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::
                operator[](in_stack_ffffffffffffff50,
                           (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      iVar3 = vec<unsigned_int>::size(pvVar10);
      pvVar10 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::
                operator[](in_stack_ffffffffffffff50,
                           (int *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      iVar4 = vec<unsigned_int>::size(pvVar10);
      if (iVar3 < iVar4) {
        pLVar8 = Clause::operator[]((Clause *)this_00,local_3c);
        local_34 = var((Lit)pLVar8->x);
      }
    }
    pvVar10 = OccLists<int,_Minisat::vec<unsigned_int>,_Minisat::SimpSolver::ClauseDeleted>::lookup
                        (in_stack_ffffffffffffff60,
                         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    puVar11 = Minisat::vec::operator_cast_to_unsigned_int_((vec *)pvVar10);
    in_stack_ffffffffffffff5c = 0;
    while ((l_00.x = in_stack_ffffffffffffff5c, iVar3 = vec<unsigned_int>::size(pvVar10),
           in_stack_ffffffffffffff5c < iVar3 &&
           (uVar6 = Clause::mark((Clause *)this_00), uVar6 == 0))) {
      uVar1 = (in_RDI->super_Solver).statistics.simpSteps;
      (in_RDI->super_Solver).statistics.simpSteps = uVar1 + 1;
      if (uVar1 != 0) {
        pCVar9 = ClauseAllocator::operator[]
                           ((ClauseAllocator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
        uVar6 = Clause::mark(pCVar9);
        if ((uVar6 == 0) && (puVar11[l_00.x] != uVar5)) {
          if (in_RDI->subsumption_lim != -1) {
            pCVar9 = ClauseAllocator::operator[]
                               ((ClauseAllocator *)in_stack_ffffffffffffff50,
                                in_stack_ffffffffffffff4c);
            iVar3 = Clause::size(pCVar9);
            if (in_RDI->subsumption_lim <= iVar3) goto LAB_0015caa9;
          }
          in_stack_ffffffffffffff50 = this_00;
          ClauseAllocator::operator[]((ClauseAllocator *)this_00,in_stack_ffffffffffffff4c);
          local_60 = Clause::subsumes((Clause *)
                                      CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                      (Clause *)
                                      CONCAT44(in_stack_ffffffffffffff94.x,
                                               in_stack_ffffffffffffff90.x));
          in_stack_ffffffffffffff9c = 0xfffffffe;
          bVar2 = Lit::operator==(&local_60,(Lit)0xfffffffe);
          if (bVar2) {
            local_1c = local_1c + 1;
            removeClause((SimpSolver *)
                         CONCAT44(in_stack_ffffffffffffff94.x,in_stack_ffffffffffffff90.x),
                         in_stack_ffffffffffffff8c.x);
          }
          else {
            in_stack_ffffffffffffff98 = 0xffffffff;
            bVar2 = Lit::operator!=(&local_60,(Lit)0xffffffff);
            if (bVar2) {
              local_20 = local_20 + 1;
              in_stack_ffffffffffffff4c = puVar11[l_00.x];
              in_stack_ffffffffffffff90.x = local_60.x;
              in_stack_ffffffffffffff94 = operator~(local_60);
              bVar2 = strengthenClause((SimpSolver *)
                                       CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                                       ,in_stack_ffffffffffffff94.x,l_00);
              if (((bVar2 ^ 0xffU) & 1) != 0) {
                return false;
              }
              in_stack_ffffffffffffff8c.x = local_60.x;
              iVar3 = var(local_60);
              if (iVar3 == local_34) {
                l_00.x = l_00.x + -1;
              }
            }
          }
        }
      }
LAB_0015caa9:
      in_stack_ffffffffffffff5c = l_00.x + 1;
    }
  } while( true );
}

Assistant:

bool SimpSolver::backwardSubsumptionCheck(bool verbose)
{
    int cnt = 0;
    int subsumed = 0;
    int deleted_literals = 0;
    assert(decisionLevel() == 0);

    while (subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()) {

        // Empty subsumption queue and return immediately on user-interrupt:
        if (asynch_interrupt || !isInSimpLimit()) {
            subsumption_queue.clear();
            bwdsub_assigns = trail.size();
            break;
        }

        // Check top-level assignments by creating a dummy clause and placing it in the queue:
        if (subsumption_queue.size() == 0 && bwdsub_assigns < trail.size()) {
            Lit l = trail[bwdsub_assigns++];
            ca[bwdsub_tmpunit][0] = l;
            ca[bwdsub_tmpunit].calcAbstraction();
            subsumption_queue.insert(bwdsub_tmpunit);
            statistics.simpSteps++;
        }

        CRef cr = subsumption_queue.peek();
        subsumption_queue.pop();
        Clause &c = ca[cr];
        statistics.simpSteps++;

        if (c.mark()) continue;

        c.setOnQueue(false);

        if (verbose && verbosity >= 2 && cnt++ % 1000 == 0)
            printf("c subsumption left: %10d (%10d subsumed, %10d deleted literals)\r", subsumption_queue.size(),
                   subsumed, deleted_literals);

        assert(c.size() > 1 || value(c[0]) == l_True); // Unit-clauses should have been propagated before this point.

        // Find best variable to scan:
        Var best = var(c[0]);
        for (int i = 1; i < c.size(); i++)
            if (occurs[var(c[i])].size() < occurs[best].size()) best = var(c[i]);

        // Search all candidates:
        vec<CRef> &_cs = occurs.lookup(best);
        CRef *cs = (CRef *)_cs;

        for (int j = 0; j < _cs.size(); j++)
            if (c.mark())
                break;
            else if (statistics.simpSteps++ && !ca[cs[j]].mark() && cs[j] != cr &&
                     (subsumption_lim == -1 || ca[cs[j]].size() < subsumption_lim)) {
                Lit l = c.subsumes(ca[cs[j]]);

                if (l == lit_Undef)
                    subsumed++, removeClause(cs[j]);
                else if (l != lit_Error) {
                    deleted_literals++;

                    if (!strengthenClause(cs[j], ~l)) return false;

                    // Did current candidate get deleted from cs? Then check candidate at index j again:
                    if (var(l) == best) j--;
                }
            }
    }

    return true;
}